

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O3

VkSamplerCreateInfo *
vk::mapSampler(VkSamplerCreateInfo *__return_storage_ptr__,Sampler *sampler,TextureFormat *format,
              float minLod,float maxLod)

{
  long lVar1;
  float fVar2;
  float fVar3;
  CompareMode CVar4;
  deUint32 dVar5;
  FilterMode FVar6;
  long lVar7;
  TextureChannelClass TVar8;
  VkBorderColor VVar9;
  ulong uVar10;
  ulong uVar11;
  VkFilter VVar12;
  VkCompareOp VVar13;
  VkSamplerAddressMode VVar14;
  VkSamplerAddressMode VVar15;
  uint uVar16;
  VkFilter VVar17;
  float afStack_44 [4];
  float fStack_34;
  undefined8 uStack_30;
  
  CVar4 = sampler->compare;
  if ((long)(int)CVar4 == 0) {
    VVar13 = VK_COMPARE_OP_ALWAYS;
  }
  else {
    VVar13 = VK_COMPARE_OP_NEVER;
    if (CVar4 < COMPAREMODE_NEVER) {
      VVar13 = *(VkCompareOp *)(&DAT_00227768 + (long)(int)CVar4 * 4);
    }
  }
  TVar8 = tcu::getTextureChannelClass(format->type);
  if (TVar8 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    dVar5 = (sampler->borderColor).v.uData[0];
    uStack_30 = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
    afStack_44[1] = 0.0;
    afStack_44[2] = 0.0;
    if (dVar5 == 0) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_0018132f;
        lVar1 = uVar10 * 4;
        uVar11 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar11;
      } while (*(float *)((long)&uStack_30 + lVar1) == afStack_44[lVar7]);
      VVar9 = VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
      if (2 < uVar11) goto LAB_00181408;
      afStack_44[1] = 0.0;
      afStack_44[2] = 1.4013e-45;
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_00181403;
        lVar1 = uVar10 * 4;
        uVar11 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar11;
      } while (*(float *)((long)&uStack_30 + lVar1) == afStack_44[lVar7]);
      VVar9 = VK_BORDER_COLOR_INT_OPAQUE_BLACK;
      if (2 < uVar11) goto LAB_00181408;
    }
    afStack_44[1] = 1.4013e-45;
    afStack_44[2] = 1.4013e-45;
    if (dVar5 == 1) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_001813b0;
        lVar1 = uVar10 * 4;
        uVar11 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar11;
      } while (*(float *)((long)&uStack_30 + lVar1) == afStack_44[lVar7]);
LAB_001811eb:
      VVar9 = VK_BORDER_COLOR_INT_OPAQUE_WHITE;
LAB_001813e5:
      if (2 < uVar11) goto LAB_00181408;
    }
  }
  else if (TVar8 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    dVar5 = (sampler->borderColor).v.uData[0];
    uStack_30 = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
    afStack_44[1] = 0.0;
    afStack_44[2] = 0.0;
    if (dVar5 == 0) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_0018132f;
        lVar1 = uVar10 * 4;
        uVar11 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar11;
      } while (*(float *)((long)&uStack_30 + lVar1) == afStack_44[lVar7]);
      VVar9 = VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
      if (2 < uVar11) goto LAB_00181408;
      afStack_44[1] = 0.0;
      afStack_44[2] = 1.4013e-45;
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_00181403;
        lVar1 = uVar10 * 4;
        uVar11 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar11;
      } while (*(float *)((long)&uStack_30 + lVar1) == afStack_44[lVar7]);
      VVar9 = VK_BORDER_COLOR_INT_OPAQUE_BLACK;
      if (2 < uVar11) goto LAB_00181408;
    }
    afStack_44[1] = 1.4013e-45;
    afStack_44[2] = 1.4013e-45;
    if (dVar5 == 1) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_001813b0;
        lVar1 = uVar10 * 4;
        uVar11 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar11;
      } while (*(float *)((long)&uStack_30 + lVar1) == afStack_44[lVar7]);
      goto LAB_001811eb;
    }
  }
  else {
    fVar3 = (sampler->borderColor).v.fData[0];
    uStack_30 = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
    afStack_44[1] = 0.0;
    afStack_44[2] = 0.0;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) {
          VVar9 = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
          goto LAB_00181408;
        }
        fVar2 = *(float *)((long)&uStack_30 + uVar10 * 4);
        uVar11 = uVar10 + 1;
        lVar1 = uVar10 + 1;
      } while ((fVar2 == afStack_44[lVar1]) &&
              (uVar10 = uVar11, !NAN(fVar2) && !NAN(afStack_44[lVar1])));
      VVar9 = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
      if (2 < uVar11) goto LAB_00181408;
      afStack_44[1] = 0.0;
      afStack_44[2] = 1.0;
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) {
          VVar9 = VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
          goto LAB_00181408;
        }
        fVar2 = *(float *)((long)&uStack_30 + uVar10 * 4);
        uVar11 = uVar10 + 1;
        lVar1 = uVar10 + 1;
      } while ((fVar2 == afStack_44[lVar1]) &&
              (uVar10 = uVar11, !NAN(fVar2) && !NAN(afStack_44[lVar1])));
      VVar9 = VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
      if (2 < uVar11) goto LAB_00181408;
    }
    afStack_44[1] = 1.0;
    afStack_44[2] = 1.0;
    if ((fVar3 == 1.0) && (!NAN(fVar3))) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) {
          VVar9 = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
          goto LAB_00181408;
        }
        fVar3 = *(float *)((long)&uStack_30 + uVar10 * 4);
        uVar11 = uVar10 + 1;
        lVar1 = uVar10 + 1;
      } while ((fVar3 == afStack_44[lVar1]) &&
              (uVar10 = uVar11, !NAN(fVar3) && !NAN(afStack_44[lVar1])));
      VVar9 = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
      goto LAB_001813e5;
    }
  }
  VVar9 = VK_BORDER_COLOR_LAST;
LAB_00181408:
  FVar6 = sampler->minFilter;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  uVar16 = sampler->magFilter - LINEAR;
  VVar12 = VK_FILTER_NEAREST;
  VVar17 = VK_FILTER_NEAREST;
  if (uVar16 < 5) {
    VVar17 = *(VkFilter *)(&DAT_00227788 + (ulong)uVar16 * 4);
  }
  __return_storage_ptr__->magFilter = VVar17;
  if (FVar6 - LINEAR < 5) {
    VVar12 = *(VkFilter *)(&DAT_00227788 + (ulong)(FVar6 - LINEAR) * 4);
  }
  __return_storage_ptr__->minFilter = VVar12;
  __return_storage_ptr__->mipmapMode = (uint)((FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0);
  VVar14 = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  VVar15 = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  if ((ulong)sampler->wrapS < 7) {
    VVar15 = *(VkSamplerAddressMode *)(&DAT_0022779c + (ulong)sampler->wrapS * 4);
  }
  __return_storage_ptr__->addressModeU = VVar15;
  if ((ulong)sampler->wrapT < 7) {
    VVar14 = *(VkSamplerAddressMode *)(&DAT_0022779c + (ulong)sampler->wrapT * 4);
  }
  __return_storage_ptr__->addressModeV = VVar14;
  VVar15 = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  if ((ulong)sampler->wrapR < 7) {
    VVar15 = *(VkSamplerAddressMode *)(&DAT_0022779c + (ulong)sampler->wrapR * 4);
  }
  __return_storage_ptr__->addressModeW = VVar15;
  __return_storage_ptr__->mipLodBias = 0.0;
  __return_storage_ptr__->anisotropyEnable = 0;
  __return_storage_ptr__->maxAnisotropy = 1.0;
  __return_storage_ptr__->compareEnable = (uint)(CVar4 != COMPAREMODE_NONE);
  __return_storage_ptr__->compareOp = VVar13;
  if (FVar6 < NEAREST_MIPMAP_NEAREST) {
    minLod = 0.0;
  }
  __return_storage_ptr__->minLod = minLod;
  if (FVar6 < NEAREST_MIPMAP_NEAREST) {
    maxLod = 0.25;
  }
  __return_storage_ptr__->maxLod = maxLod;
  __return_storage_ptr__->borderColor = VVar9;
  __return_storage_ptr__->unnormalizedCoordinates = sampler->normalizedCoords ^ 1;
  return __return_storage_ptr__;
LAB_0018132f:
  VVar9 = VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
  goto LAB_00181408;
LAB_00181403:
  VVar9 = VK_BORDER_COLOR_INT_OPAQUE_BLACK;
  goto LAB_00181408;
LAB_001813b0:
  VVar9 = VK_BORDER_COLOR_INT_OPAQUE_WHITE;
  goto LAB_00181408;
}

Assistant:

VkSamplerCreateInfo mapSampler (const tcu::Sampler& sampler, const tcu::TextureFormat& format, float minLod, float maxLod)
{
	const bool					compareEnabled	= (sampler.compare != tcu::Sampler::COMPAREMODE_NONE);
	const VkCompareOp			compareOp		= (compareEnabled) ? (mapCompareMode(sampler.compare)) : (VK_COMPARE_OP_ALWAYS);
	const VkBorderColor			borderColor		= mapBorderColor(getTextureChannelClass(format.type), sampler.borderColor);
	const bool					isMipmapEnabled	= (sampler.minFilter != tcu::Sampler::NEAREST && sampler.minFilter != tcu::Sampler::LINEAR);

	const VkSamplerCreateInfo	createInfo		=
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
		DE_NULL,
		(VkSamplerCreateFlags)0,
		mapFilterMode(sampler.magFilter),							// magFilter
		mapFilterMode(sampler.minFilter),							// minFilter
		mapMipmapMode(sampler.minFilter),							// mipMode
		mapWrapMode(sampler.wrapS),									// addressU
		mapWrapMode(sampler.wrapT),									// addressV
		mapWrapMode(sampler.wrapR),									// addressW
		0.0f,														// mipLodBias
		VK_FALSE,													// anisotropyEnable
		1.0f,														// maxAnisotropy
		(VkBool32)(compareEnabled ? VK_TRUE : VK_FALSE),			// compareEnable
		compareOp,													// compareOp
		(isMipmapEnabled ? minLod : 0.0f),							// minLod
		(isMipmapEnabled ? maxLod : 0.25f),							// maxLod
		borderColor,												// borderColor
		(VkBool32)(sampler.normalizedCoords ? VK_FALSE : VK_TRUE),	// unnormalizedCoords
	};

	return createInfo;
}